

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O1

UChar32 utf8IteratorCurrent(UCharIterator *iter)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar6;
  
  if (iter->reservedField == 0) {
    lVar7 = (long)iter->start;
    uVar3 = iter->limit;
    uVar2 = 0xffffffff;
    if (iter->start < (int)uVar3) {
      pvVar1 = iter->context;
      bVar9 = *(byte *)((long)pvVar1 + lVar7);
      uVar4 = (uint)bVar9;
      uVar2 = uVar4;
      if ((char)bVar9 < '\0') {
        uVar6 = lVar7 + 1;
        uVar2 = 0xfffd;
        if ((uint)uVar6 != uVar3) {
          if (bVar9 < 0xe0) {
            if (bVar9 < 0xc2) goto LAB_002b0cb3;
            uVar4 = uVar4 & 0x1f;
          }
          else {
            if (bVar9 < 0xf0) {
              uVar4 = uVar4 & 0xf;
              if (((byte)" 000000000000\x1000"[uVar4] >> (*(byte *)((long)pvVar1 + uVar6) >> 5) & 1)
                  == 0) goto LAB_002b0cb3;
              bVar9 = *(byte *)((long)pvVar1 + uVar6) & 0x3f;
            }
            else {
              if (0xf4 < bVar9) goto LAB_002b0cb3;
              if (((((uint)(int)""[*(byte *)((long)pvVar1 + uVar6) >> 4] >> (uVar4 - 0xf0 & 0x1f) &
                    1) == 0) || (uVar8 = lVar7 + 2, (uint)uVar8 == uVar3)) ||
                 (bVar9 = *(char *)((long)pvVar1 + uVar8) + 0x80, 0x3f < bVar9)) goto LAB_002b0cb3;
              uVar4 = *(byte *)((long)pvVar1 + uVar6) & 0x3f | (uVar4 - 0xf0) * 0x40;
              uVar6 = uVar8 & 0xffffffff;
            }
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
            if (uVar5 == uVar3) goto LAB_002b0cb3;
            uVar4 = (uint)bVar9 | uVar4 << 6;
          }
          uVar3 = *(byte *)((long)pvVar1 + (long)(int)uVar6) ^ 0x80;
          if ((byte)uVar3 < 0x40) {
            uVar2 = uVar4 << 6 | uVar3;
          }
        }
      }
LAB_002b0cb3:
      uVar3 = (uVar2 >> 10) + 0xd7c0 & 0xffff;
      if ((int)uVar2 < 0x10000) {
        uVar3 = uVar2;
      }
      return uVar3;
    }
  }
  else {
    uVar2 = iter->reservedField & 0x3ffU | 0xdc00;
  }
  return uVar2;
}

Assistant:

static UChar32 U_CALLCONV
utf8IteratorCurrent(UCharIterator *iter) {
    if(iter->reservedField!=0) {
        return U16_TRAIL(iter->reservedField);
    } else if(iter->start<iter->limit) {
        const uint8_t *s=(const uint8_t *)iter->context;
        UChar32 c;
        int32_t i=iter->start;

        U8_NEXT_OR_FFFD(s, i, iter->limit, c);
        if(c<=0xffff) {
            return c;
        } else {
            return U16_LEAD(c);
        }
    } else {
        return U_SENTINEL;
    }
}